

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  in_addr_t iVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  undefined8 uVar8;
  size_t sVar9;
  byte bVar10;
  char *pcVar11;
  byte bVar12;
  long lVar13;
  bool bVar14;
  size_t sStack_460;
  sockaddr_in sin;
  char mem [1024];
  
  iVar1 = 0x100007f;
  if ((1 < argc) && (iVar1 = inet_addr(argv[1]), argc != 2)) {
    username = argv[2];
    if ((3 < (uint)argc) && (password = argv[3], argc != 4)) {
      sftppath = argv[4];
    }
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket.\n",0x19,1,_stderr);
    goto LAB_00101873;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar1;
  iVar3 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar3 == 0) {
    lVar4 = libssh2_session_init_ex(0,0,0,0);
    if (lVar4 == 0) {
      pcVar11 = "Could not initialize SSH session.\n";
      sStack_460 = 0x22;
      goto LAB_0010142f;
    }
    libssh2_session_set_blocking(lVar4,1);
    uVar2 = libssh2_session_handshake(lVar4,__fd);
    if (uVar2 == 0) {
      lVar5 = libssh2_hostkey_hash(lVar4,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      for (lVar13 = 0; lVar13 != 0x14; lVar13 = lVar13 + 1) {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + lVar13));
      }
      fputc(10,_stderr);
      pcVar11 = username;
      sVar6 = strlen(username);
      pcVar11 = (char *)libssh2_userauth_list(lVar4,pcVar11,sVar6 & 0xffffffff);
      if (pcVar11 == (char *)0x0) {
LAB_00101504:
        fwrite("libssh2_sftp_init().\n",0x15,1,_stderr);
        lVar5 = libssh2_sftp_init(lVar4);
        if (lVar5 != 0) {
          fwrite("libssh2_sftp_open().\n",0x15,1,_stderr);
          pcVar11 = sftppath;
          sVar6 = strlen(sftppath);
          lVar13 = libssh2_sftp_open_ex(lVar5,pcVar11,sVar6 & 0xffffffff,1,0,0);
          __stream = _stderr;
          if (lVar13 == 0) {
            uVar8 = libssh2_sftp_last_error();
            fprintf(__stream,"Unable to open file with SFTP: %ld\n",uVar8);
          }
          else {
            fwrite("libssh2_sftp_open() is done, now receive data.\n",0x2f,1,_stderr);
            while( true ) {
              fwrite("libssh2_sftp_read().\n",0x15,1,_stderr);
              sVar6 = libssh2_sftp_read(lVar13,mem,0x400);
              if ((long)sVar6 < 1) break;
              write(1,mem,sVar6);
            }
            libssh2_sftp_close_handle(lVar13);
            libssh2_sftp_shutdown(lVar5);
          }
          goto LAB_00101841;
        }
        pcVar11 = "Unable to init SFTP session\n";
        sStack_460 = 0x1c;
      }
      else {
        fprintf(_stderr,"Authentication methods: %s\n",pcVar11);
        pcVar7 = strstr(pcVar11,"password");
        bVar14 = pcVar7 != (char *)0x0;
        pcVar7 = strstr(pcVar11,"keyboard-interactive");
        bVar12 = bVar14 + 2;
        if (pcVar7 == (char *)0x0) {
          bVar12 = bVar14;
        }
        pcVar7 = strstr(pcVar11,"publickey");
        pcVar11 = username;
        bVar10 = bVar12 + 4;
        if (pcVar7 == (char *)0x0) {
          bVar10 = bVar12;
        }
        if (5 < argc) {
          if ((((bVar14) && (pcVar7 = argv[5], *pcVar7 == '-')) && (pcVar7[1] == 'p')) &&
             (pcVar7[2] == '\0')) {
            bVar10 = 0;
            bVar14 = true;
          }
          if ((((bVar10 & 2) != 0) && (pcVar7 = argv[5], *pcVar7 == '-')) &&
             ((pcVar7[1] == 'i' && (pcVar7[2] == '\0')))) {
            bVar10 = 2;
            bVar14 = false;
          }
          if ((((bVar10 & 4) != 0) && (pcVar7 = argv[5], *pcVar7 == '-')) &&
             ((pcVar7[1] == 'k' && (pcVar7[2] == '\0')))) {
            bVar10 = 4;
            bVar14 = false;
          }
        }
        if (bVar14) {
          sVar6 = strlen(username);
          pcVar7 = password;
          sVar9 = strlen(password);
          iVar3 = libssh2_userauth_password_ex
                            (lVar4,pcVar11,sVar6 & 0xffffffff,pcVar7,sVar9 & 0xffffffff,0);
          if (iVar3 == 0) goto LAB_00101504;
          pcVar11 = "Authentication by password failed.\n";
          sStack_460 = 0x23;
        }
        else if ((bVar10 & 2) == 0) {
          if ((bVar10 & 4) == 0) {
            pcVar11 = "No supported authentication methods found.\n";
            sStack_460 = 0x2b;
          }
          else {
            sVar6 = strlen(username);
            iVar3 = libssh2_userauth_publickey_fromfile_ex
                              (lVar4,pcVar11,sVar6 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                               "/home/username/.ssh/id_rsa",password);
            if (iVar3 == 0) {
              pcVar11 = "Authentication by public key succeeded.\n";
              sStack_460 = 0x28;
              goto LAB_00101816;
            }
            pcVar11 = "Authentication by public key failed.\n";
            sStack_460 = 0x25;
          }
        }
        else {
          sVar6 = strlen(username);
          iVar3 = libssh2_userauth_keyboard_interactive_ex
                            (lVar4,pcVar11,sVar6 & 0xffffffff,kbd_callback);
          if (iVar3 == 0) {
            pcVar11 = "Authentication by keyboard-interactive succeeded.\n";
            sStack_460 = 0x32;
LAB_00101816:
            fwrite(pcVar11,sStack_460,1,_stderr);
            goto LAB_00101504;
          }
          pcVar11 = "Authentication by keyboard-interactive failed.\n";
          sStack_460 = 0x2f;
        }
      }
      fwrite(pcVar11,sStack_460,1,_stderr);
    }
    else {
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
    }
LAB_00101841:
    libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar4);
  }
  else {
    pcVar11 = "failed to connect.\n";
    sStack_460 = 0x13;
LAB_0010142f:
    fwrite(pcVar11,sStack_460,1,_stderr);
  }
  shutdown(__fd,2);
  close(__fd);
LAB_00101873:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Since we have set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 5) {
            if((auth_pw & 1) && !strcmp(argv[5], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[5], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[5], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init().\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open().\n");
    /* Request a file via SFTP */
    sftp_handle = libssh2_sftp_open(sftp_session, sftppath,
                                    LIBSSH2_FXF_READ, 0);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open file with SFTP: %ld\n",
                libssh2_sftp_last_error(sftp_session));
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_open() is done, now receive data.\n");
    do {
        char mem[1024];
        ssize_t nread;

        /* loop until we fail */
        fprintf(stderr, "libssh2_sftp_read().\n");
        nread = libssh2_sftp_read(sftp_handle, mem, sizeof(mem));
        if(nread > 0) {
            write(1, mem, (size_t)nread);
        }
        else {
            break;
        }
    } while(1);

    libssh2_sftp_close(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}